

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.c
# Opt level: O0

int nn_literal_resolve(char *addr,size_t addrlen,int ipv4only,sockaddr_storage *result,
                      size_t *resultlen)

{
  FILE *pFVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  uint *puVar5;
  undefined8 local_8c;
  in6_addr in6addr;
  in_addr inaddr;
  char addrz [46];
  int rc;
  size_t *resultlen_local;
  sockaddr_storage *result_local;
  int ipv4only_local;
  size_t addrlen_local;
  char *addr_local;
  
  if ((addrlen == 0) || (*addr != '[')) {
    if (0x2e < addrlen + 1) {
      return -0x16;
    }
    memcpy((void *)((long)&in6addr.__in6_u + 0xc),addr,addrlen);
    in6addr.__in6_u.__u6_addr8[addrlen + 0xc] = '\0';
  }
  else {
    if (addr[addrlen - 1] != ']') {
      return -0x16;
    }
    if (0x2e < addrlen - 1) {
      return -0x16;
    }
    memcpy((void *)((long)&in6addr.__in6_u + 0xc),addr + 1,addrlen - 2);
    in6addr.__in6_u.__u6_addr8[addrlen + 10] = '\0';
  }
  if (ipv4only == 0) {
    iVar2 = nn_inet_pton(10,(char *)(in6addr.__in6_u.__u6_addr8 + 0xc),&local_8c);
    pFVar1 = _stderr;
    if (iVar2 == 1) {
      if (result != (sockaddr_storage *)0x0) {
        result->ss_family = 10;
        *(undefined8 *)(result->__ss_padding + 6) = local_8c;
        *(undefined8 *)(result->__ss_padding + 0xe) = in6addr.__in6_u._0_8_;
      }
      if (resultlen != (size_t *)0x0) {
        *resultlen = 0x1c;
      }
      return 0;
    }
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      pcVar4 = nn_err_strerror(*piVar3);
      puVar5 = (uint *)__errno_location();
      fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/utils/literal.c"
              ,0x72);
      fflush(_stderr);
      nn_err_abort();
    }
  }
  iVar2 = nn_inet_pton(2,(char *)(in6addr.__in6_u.__u6_addr8 + 0xc),
                       (void *)((long)&in6addr.__in6_u + 8));
  pFVar1 = _stderr;
  if (iVar2 == 1) {
    if (result != (sockaddr_storage *)0x0) {
      result->ss_family = 2;
      *(uint32_t *)(result->__ss_padding + 2) = in6addr.__in6_u.__u6_addr32[2];
    }
    if (resultlen != (size_t *)0x0) {
      *resultlen = 0x10;
    }
    addr_local._4_4_ = 0;
  }
  else {
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      pcVar4 = nn_err_strerror(*piVar3);
      puVar5 = (uint *)__errno_location();
      fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/utils/literal.c"
              ,0x80);
      fflush(_stderr);
      nn_err_abort();
    }
    addr_local._4_4_ = -0x16;
  }
  return addr_local._4_4_;
}

Assistant:

int nn_literal_resolve (const char *addr, size_t addrlen,
    int ipv4only, struct sockaddr_storage *result, size_t *resultlen)
{
    int rc;
    char addrz [INET6_ADDRSTRLEN > INET_ADDRSTRLEN ?
        INET6_ADDRSTRLEN :  INET_ADDRSTRLEN];
    struct in_addr inaddr;
    struct in6_addr in6addr;

    /*  Try to treat the address as a literal string. If the size of
        the address is larger than longest possible literal, skip the step.
        If the literal in enclosed in square brackets ignore them. */
    if (addrlen > 0 && addr [0] == '[') {
        if (addr [addrlen - 1] != ']')
            return -EINVAL;
        if (addrlen - 2 + 1 > sizeof (addrz))
            return -EINVAL;
        memcpy (addrz, addr + 1, addrlen - 2);
        addrz [addrlen - 2] = 0;
    }
    else {
        if (addrlen + 1 > sizeof (addrz))
            return -EINVAL;
        memcpy (addrz, addr, addrlen);
        addrz [addrlen] = 0;
    }

    /*  Try to interpret the literal as an IPv6 address. */
    if (!ipv4only) {
        rc = nn_inet_pton (AF_INET6, addrz, &in6addr);
        if (rc == 1) {
            if (result) {
                result->ss_family = AF_INET6;
                ((struct sockaddr_in6*) result)->sin6_addr = in6addr;
             }
             if (resultlen)
                *resultlen = sizeof (struct sockaddr_in6);
            return 0;
        }
        errno_assert (rc == 0);
    }

    /*  Try to interpret the literal as an IPv4 address. */
    rc = nn_inet_pton (AF_INET, addrz, &inaddr);
    if (rc == 1) {
        if (result) {
           result->ss_family = AF_INET;
           ((struct sockaddr_in*) result)->sin_addr = inaddr;
        }
        if (resultlen)
            *resultlen = sizeof (struct sockaddr_in);
        return 0;
    }
    errno_assert (rc == 0);

    /*  The supplied string is not a valid literal address. */
    return -EINVAL;
}